

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP5Writer::InitParameters(BP5Writer *this)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  long in_RDI;
  size_t k_1;
  size_t k;
  uint nproc;
  BP5Params *in_stack_00001c80;
  IO *in_stack_00001c88;
  BP5Engine *in_stack_00001c90;
  undefined1 local_21;
  
  BP5Engine::ParseParams(in_stack_00001c90,in_stack_00001c88,in_stack_00001c80);
  bVar1 = std::__cxx11::string::empty();
  *(byte *)(in_RDI + 0x7c9) = (bVar1 ^ 0xff) & 1;
  local_21 = 0;
  if ((*(byte *)(in_RDI + 0x7c9) & 1) != 0) {
    local_21 = *(byte *)(in_RDI + 0x169);
  }
  *(byte *)(in_RDI + 0x7ca) = local_21 & 1;
  uVar2 = helper::Comm::Size((Comm *)0xa8b2b7);
  uVar3 = helper::SetWithinLimit<unsigned_int>(*(uint *)(in_RDI + 0x198),0,uVar2);
  *(uint *)(in_RDI + 0x198) = uVar3;
  uVar3 = helper::SetWithinLimit<unsigned_int>(*(uint *)(in_RDI + 0x1a0),0,uVar2);
  *(uint *)(in_RDI + 0x1a0) = uVar3;
  uVar3 = helper::SetWithinLimit<unsigned_int>(*(uint *)(in_RDI + 0x19c),0,uVar2);
  *(uint *)(in_RDI + 0x19c) = uVar3;
  if (*(int *)(in_RDI + 0x198) == 0) {
    if (*(int *)(in_RDI + 0x19c) == 0) {
      if (*(int *)(in_RDI + 0x1a0) != 0) {
        uVar2 = helper::SetWithinLimit<unsigned_int>(*(uint *)(in_RDI + 0x1a0),0,uVar2);
        *(uint *)(in_RDI + 0x198) = uVar2;
      }
    }
    else {
      uVar2 = helper::SetWithinLimit<unsigned_int>(uVar2 / *(uint *)(in_RDI + 0x19c),0,uVar2);
      *(uint *)(in_RDI + 0x198) = uVar2;
    }
  }
  uVar2 = helper::SetWithinLimit<unsigned_int>
                    (*(uint *)(in_RDI + 0x1a0),0,*(uint *)(in_RDI + 0x198));
  *(uint *)(in_RDI + 0x1a0) = uVar2;
  uVar2 = helper::SetWithinLimit<unsigned_int>(*(uint *)(in_RDI + 0x1a4),0,0x4000000);
  *(uint *)(in_RDI + 0x1a4) = uVar2;
  if (*(int *)(in_RDI + 0x1a4) == 0) {
    *(undefined4 *)(in_RDI + 0x1a4) = 0x1000;
  }
  if ((*(byte *)(in_RDI + 0x1a8) & 1) != 0) {
    if (*(int *)(in_RDI + 0x1b0) == 0) {
      *(undefined4 *)(in_RDI + 0x1b0) = *(undefined4 *)(in_RDI + 0x1ac);
    }
    *(ulong *)(in_RDI + 0x2b8) = (ulong)*(uint *)(in_RDI + 0x1ac);
    *(ulong *)(in_RDI + 0x2b0) = (ulong)*(uint *)(in_RDI + 0x1b0);
    if (*(uint *)(in_RDI + 0x1a4) % *(uint *)(in_RDI + 0x1ac) != 0) {
      *(uint *)(in_RDI + 0x1a4) =
           (*(uint *)(in_RDI + 0x1a4) / *(uint *)(in_RDI + 0x1ac) + 1) * *(int *)(in_RDI + 0x1ac);
    }
    if (*(ulong *)(in_RDI + 0x1d8) % (ulong)*(uint *)(in_RDI + 0x1ac) != 0) {
      *(ulong *)(in_RDI + 0x1d8) =
           (*(ulong *)(in_RDI + 0x1d8) / (ulong)*(uint *)(in_RDI + 0x1ac) + 1) *
           (ulong)*(uint *)(in_RDI + 0x1ac);
    }
  }
  *(undefined4 *)(in_RDI + 0x2a0) = *(undefined4 *)(in_RDI + 0x214);
  return;
}

Assistant:

void BP5Writer::InitParameters()
{
    ParseParams(m_IO, m_Parameters);
    m_WriteToBB = !(m_Parameters.BurstBufferPath.empty());
    m_DrainBB = m_WriteToBB && m_Parameters.BurstBufferDrain;

    unsigned int nproc = (unsigned int)m_Comm.Size();
    m_Parameters.NumAggregators = helper::SetWithinLimit(m_Parameters.NumAggregators, 0U, nproc);
    m_Parameters.NumSubFiles = helper::SetWithinLimit(m_Parameters.NumSubFiles, 0U, nproc);
    m_Parameters.AggregatorRatio = helper::SetWithinLimit(m_Parameters.AggregatorRatio, 0U, nproc);
    if (m_Parameters.NumAggregators == 0)
    {
        if (m_Parameters.AggregatorRatio > 0)
        {
            m_Parameters.NumAggregators =
                helper::SetWithinLimit(nproc / m_Parameters.AggregatorRatio, 0U, nproc);
        }
        else if (m_Parameters.NumSubFiles > 0)
        {
            m_Parameters.NumAggregators =
                helper::SetWithinLimit(m_Parameters.NumSubFiles, 0U, nproc);
        }
    }
    m_Parameters.NumSubFiles =
        helper::SetWithinLimit(m_Parameters.NumSubFiles, 0U, m_Parameters.NumAggregators);

    // Limiting to max 64MB page size
    m_Parameters.StripeSize = helper::SetWithinLimit(m_Parameters.StripeSize, 0U, 67108864U);
    if (m_Parameters.StripeSize == 0)
    {
        m_Parameters.StripeSize = 4096;
    }

    if (m_Parameters.DirectIO)
    {
        if (m_Parameters.DirectIOAlignBuffer == 0)
        {
            m_Parameters.DirectIOAlignBuffer = m_Parameters.DirectIOAlignOffset;
        }
        m_BP5Serializer.m_BufferBlockSize = m_Parameters.DirectIOAlignOffset;
        m_BP5Serializer.m_BufferAlign = m_Parameters.DirectIOAlignBuffer;
        if (m_Parameters.StripeSize % m_Parameters.DirectIOAlignOffset)
        {
            size_t k = m_Parameters.StripeSize / m_Parameters.DirectIOAlignOffset + 1;
            m_Parameters.StripeSize = (unsigned int)(k * m_Parameters.DirectIOAlignOffset);
        }
        if (m_Parameters.BufferChunkSize % m_Parameters.DirectIOAlignOffset)
        {
            size_t k = m_Parameters.BufferChunkSize / m_Parameters.DirectIOAlignOffset + 1;
            m_Parameters.BufferChunkSize = k * m_Parameters.DirectIOAlignOffset;
        }
    }

    m_BP5Serializer.m_StatsLevel = m_Parameters.StatsLevel;
}